

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

void __thiscall
QGraphicsAnchorLayoutPrivate::removeCenterAnchors
          (QGraphicsAnchorLayoutPrivate *this,QGraphicsLayoutItem *item,AnchorPoint centerEdge,
          bool substitute)

{
  bool bVar1;
  QGraphicsLayoutItem *pQVar2;
  AnchorVertex *pAVar3;
  AnchorData *v2;
  AnchorData *pAVar4;
  QList<QSimplexConstraint_*> *this_00;
  qsizetype qVar5;
  const_reference ppQVar6;
  QGraphicsAnchorLayoutPrivate *this_01;
  QGraphicsAnchorLayoutPrivate *pQVar7;
  const_reference ppAVar8;
  AnchorVertex **ppAVar9;
  byte in_CL;
  int in_EDX;
  QGraphicsLayoutItem *in_RSI;
  QGraphicsAnchorLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  AnchorVertex *v;
  int i_1;
  AnchorData *data;
  int i;
  AnchorData *oldData;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *g;
  AnchorVertex *first;
  AnchorVertex *center;
  AnchorPoint lastEdge;
  AnchorPoint firstEdge;
  Orientation orientation;
  QGraphicsAnchorLayout *q;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> adjacents;
  undefined4 in_stack_ffffffffffffff08;
  Orientation in_stack_ffffffffffffff0c;
  AnchorData *in_stack_ffffffffffffff10;
  AnchorVertex *in_stack_ffffffffffffff18;
  QGraphicsAnchorLayoutPrivate *in_stack_ffffffffffffff20;
  QGraphicsAnchorLayoutPrivate *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  AnchorPoint AVar10;
  QSimplexConstraint *in_stack_ffffffffffffff38;
  QSimplexConstraint *in_stack_ffffffffffffff40;
  AnchorPoint firstEdge_00;
  AnchorData *in_stack_ffffffffffffff48;
  QGraphicsAnchorLayoutPrivate *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  AnchorVertex *in_stack_ffffffffffffff68;
  int local_8c;
  undefined4 in_stack_ffffffffffffff80;
  int iVar11;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> local_28;
  QGraphicsAnchorLayoutPrivate *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QGraphicsLayoutItem *)q_func(in_RDI);
  if (((in_EDX == 1) || (in_EDX == 4)) &&
     (pAVar3 = internalVertex(in_stack_ffffffffffffff28,
                              (QGraphicsLayoutItem *)in_stack_ffffffffffffff20,
                              (AnchorPoint)((ulong)in_stack_ffffffffffffff38 >> 0x20)),
     pAVar3 != (AnchorVertex *)0x0)) {
    v2 = (AnchorData *)
         internalVertex(in_stack_ffffffffffffff28,(QGraphicsLayoutItem *)in_stack_ffffffffffffff20,
                        (AnchorPoint)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>::
    operator[]((QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
                *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    pAVar4 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
             edgeData((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                       *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff68,
                      (AnchorVertex *)CONCAT44(in_EDX,in_stack_ffffffffffffff60));
    this_00 = QHVContainer<QList<QSimplexConstraint_*>_>::operator[]
                        ((QHVContainer<QList<QSimplexConstraint_*>_> *)in_stack_ffffffffffffff10,
                         in_stack_ffffffffffffff0c);
    qVar5 = QList<QSimplexConstraint_*>::size(this_00);
    iVar11 = (int)qVar5;
    do {
      firstEdge_00 = (AnchorPoint)((ulong)in_stack_ffffffffffffff40 >> 0x20);
      AVar10 = (AnchorPoint)((ulong)in_stack_ffffffffffffff30 >> 0x20);
      iVar11 = iVar11 + -1;
      if (iVar11 < 0) goto LAB_0093d4b0;
      QHVContainer<QList<QSimplexConstraint_*>_>::operator[]
                ((QHVContainer<QList<QSimplexConstraint_*>_> *)in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff0c);
      ppQVar6 = QList<QSimplexConstraint_*>::at
                          ((QList<QSimplexConstraint_*> *)in_stack_ffffffffffffff10,
                           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      in_stack_ffffffffffffff40 = *ppQVar6;
      in_stack_ffffffffffffff50 = (QGraphicsAnchorLayoutPrivate *)0x0;
      if (pAVar4 != (AnchorData *)0x0) {
        in_stack_ffffffffffffff50 = (QGraphicsAnchorLayoutPrivate *)&pAVar4->super_QSimplexVariable;
      }
      in_stack_ffffffffffffff48 = pAVar4;
      local_10 = in_stack_ffffffffffffff50;
      bVar1 = QHash<QSimplexVariable_*,_double>::contains
                        ((QHash<QSimplexVariable_*,_double> *)in_stack_ffffffffffffff18,
                         (QSimplexVariable **)in_stack_ffffffffffffff10);
      firstEdge_00 = (AnchorPoint)((ulong)in_stack_ffffffffffffff40 >> 0x20);
      AVar10 = (AnchorPoint)((ulong)in_stack_ffffffffffffff30 >> 0x20);
    } while (!bVar1);
    QHVContainer<QList<QSimplexConstraint_*>_>::operator[]
              ((QHVContainer<QList<QSimplexConstraint_*>_> *)in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff0c);
    in_stack_ffffffffffffff38 =
         QList<QSimplexConstraint_*>::takeAt
                   ((QList<QSimplexConstraint_*> *)in_stack_ffffffffffffff20,
                    (qsizetype)in_stack_ffffffffffffff18);
    if (in_stack_ffffffffffffff38 != (QSimplexConstraint *)0x0) {
      QSimplexConstraint::~QSimplexConstraint((QSimplexConstraint *)0x93d48d);
      operator_delete(in_stack_ffffffffffffff38,0x30);
    }
LAB_0093d4b0:
    if ((in_CL & 1) == 0) {
      local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_28.d.ptr = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
      local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
      adjacentVertices((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                        *)in_stack_ffffffffffffff18,(AnchorVertex *)in_stack_ffffffffffffff48);
      local_8c = 0;
      while( true ) {
        pQVar7 = (QGraphicsAnchorLayoutPrivate *)(long)local_8c;
        qVar5 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::size(&local_28);
        if (qVar5 <= (long)pQVar7) break;
        ppAVar8 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::at
                            ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                             in_stack_ffffffffffffff10,
                             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        if ((*ppAVar8)->m_item != in_RSI) {
          in_stack_ffffffffffffff18 = pAVar3;
          internalVertex(in_stack_ffffffffffffff28,(QGraphicsLayoutItem *)pQVar7,
                         (AnchorPoint)((ulong)in_stack_ffffffffffffff38 >> 0x20));
          removeAnchor_helper(pQVar7,in_stack_ffffffffffffff18,
                              (AnchorVertex *)in_stack_ffffffffffffff10);
        }
        local_8c = local_8c + 1;
      }
      internalVertex(in_stack_ffffffffffffff28,(QGraphicsLayoutItem *)pQVar7,
                     (AnchorPoint)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      removeAnchor_helper(pQVar7,in_stack_ffffffffffffff18,(AnchorVertex *)v2);
      QList<QtGraphicsAnchorLayout::AnchorVertex_*>::~QList
                ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93d6a6);
    }
    else {
      this_01 = (QGraphicsAnchorLayoutPrivate *)operator_new(0x80);
      QtGraphicsAnchorLayout::AnchorData::AnchorData(in_stack_ffffffffffffff10);
      pQVar7 = this_01;
      addAnchor_helper(in_stack_ffffffffffffff50,(QGraphicsLayoutItem *)in_stack_ffffffffffffff48,
                       firstEdge_00,(QGraphicsLayoutItem *)in_stack_ffffffffffffff38,AVar10,
                       (AnchorData *)this_01);
      AVar10 = (AnchorPoint)((ulong)in_stack_ffffffffffffff38 >> 0x20);
      QtGraphicsAnchorLayout::AnchorData::refreshSizeHints
                ((AnchorData *)CONCAT44(iVar11,in_stack_ffffffffffffff80),(QLayoutStyleInfo *)pQVar7
                );
      removeAnchor_helper(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                          (AnchorVertex *)in_stack_ffffffffffffff10);
      internalVertex(this_01,(QGraphicsLayoutItem *)in_stack_ffffffffffffff20,AVar10);
      removeAnchor_helper(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                          (AnchorVertex *)in_stack_ffffffffffffff10);
      v2 = in_stack_ffffffffffffff10;
    }
    if (in_RSI == pQVar2) {
      ppAVar9 = QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
                          ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)v2,
                           in_stack_ffffffffffffff0c);
      *ppAVar9 = (AnchorVertex *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::removeCenterAnchors(
    QGraphicsLayoutItem *item, Qt::AnchorPoint centerEdge,
    bool substitute)
{
    Q_Q(QGraphicsAnchorLayout);

    Qt::Orientation orientation;
    switch (centerEdge) {
    case Qt::AnchorHorizontalCenter:
        orientation = Qt::Horizontal;
        break;
    case Qt::AnchorVerticalCenter:
        orientation = Qt::Vertical;
        break;
    default:
        // Don't remove edges that not the center ones
        return;
    }

    // Orientation code
    Qt::AnchorPoint firstEdge;
    Qt::AnchorPoint lastEdge;

    if (orientation == Qt::Horizontal) {
        firstEdge = Qt::AnchorLeft;
        lastEdge = Qt::AnchorRight;
    } else {
        firstEdge = Qt::AnchorTop;
        lastEdge = Qt::AnchorBottom;
    }

    AnchorVertex *center = internalVertex(item, centerEdge);
    if (!center)
        return;
    AnchorVertex *first = internalVertex(item, firstEdge);

    Q_ASSERT(first);
    Q_ASSERT(center);

    Graph<AnchorVertex, AnchorData> &g = graph[orientation];


    AnchorData *oldData = g.edgeData(first, center);
    // Remove center constraint
    for (int i = itemCenterConstraints[orientation].size() - 1; i >= 0; --i) {
        if (itemCenterConstraints[orientation].at(i)->variables.contains(oldData)) {
            delete itemCenterConstraints[orientation].takeAt(i);
            break;
        }
    }

    if (substitute) {
        // Create the new anchor that should substitute the left-center-right anchors.
        AnchorData *data = new AnchorData;
        addAnchor_helper(item, firstEdge, item, lastEdge, data);
        data->refreshSizeHints();

        // Remove old anchors
        removeAnchor_helper(first, center);
        removeAnchor_helper(center, internalVertex(item, lastEdge));

    } else {
        // this is only called from removeAnchors()
        // first, remove all non-internal anchors
        QList<AnchorVertex*> adjacents = g.adjacentVertices(center);
        for (int i = 0; i < adjacents.size(); ++i) {
            AnchorVertex *v = adjacents.at(i);
            if (v->m_item != item) {
                removeAnchor_helper(center, internalVertex(v->m_item, v->m_edge));
            }
        }
        // when all non-internal anchors is removed it will automatically merge the
        // center anchor into a left-right (or top-bottom) anchor. We must also delete that.
        // by this time, the center vertex is deleted and merged into a non-centered internal anchor
        removeAnchor_helper(first, internalVertex(item, lastEdge));
    }

    if (item == q) {
        layoutCentralVertex[orientation] = nullptr;
    }
}